

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

void tyti::stl::write_ascii<float,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<float> *s)

{
  ostream *poVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_reference pvVar4;
  float fVar5;
  ulong local_40;
  size_t j;
  size_t i;
  size_type local_28;
  ulong local_20;
  size_t num_vertices;
  basic_solid<float> *s_local;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out_local;
  
  num_vertices = (size_t)s;
  s_local = (basic_solid<float> *)out;
  poVar1 = std::operator<<((ostream *)(out + 0x10),"solid ");
  poVar1 = std::operator<<(poVar1,(string *)num_vertices);
  std::operator<<(poVar1,"\n");
  local_28 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             size((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                   *)(num_vertices + 0x20));
  sVar2 = std::vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
          ::size((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                  *)(num_vertices + 0x38));
  i = sVar2 / 3;
  puVar3 = std::min<unsigned_long>(&local_28,&i);
  local_20 = *puVar3;
  for (j = 0; j < local_20; j = j + 1) {
    poVar1 = std::operator<<((ostream *)&(s_local->header).field_2,"\tfacet normal ");
    pvVar4 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(num_vertices + 0x20),j);
    fVar5 = basic_vec3<float>::operator[](pvVar4,0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
    poVar1 = std::operator<<(poVar1," ");
    pvVar4 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(num_vertices + 0x20),j);
    fVar5 = basic_vec3<float>::operator[](pvVar4,1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
    poVar1 = std::operator<<(poVar1," ");
    pvVar4 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(num_vertices + 0x20),j);
    fVar5 = basic_vec3<float>::operator[](pvVar4,2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
    poVar1 = std::operator<<(poVar1," ");
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&(s_local->header).field_2,"\t\touter loop\n");
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      poVar1 = std::operator<<((ostream *)&(s_local->header).field_2,"\t\t\tvertex ");
      pvVar4 = std::
               vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
               ::operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                             *)(num_vertices + 0x38),j * 3 + local_40);
      fVar5 = basic_vec3<float>::operator[](pvVar4,0);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
      poVar1 = std::operator<<(poVar1," ");
      pvVar4 = std::
               vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
               ::operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                             *)(num_vertices + 0x38),j * 3 + local_40);
      fVar5 = basic_vec3<float>::operator[](pvVar4,1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
      poVar1 = std::operator<<(poVar1," ");
      pvVar4 = std::
               vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
               ::operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                             *)(num_vertices + 0x38),j * 3 + local_40);
      fVar5 = basic_vec3<float>::operator[](pvVar4,2);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar5);
      poVar1 = std::operator<<(poVar1," ");
      std::operator<<(poVar1,"\n");
    }
    poVar1 = std::operator<<((ostream *)&(s_local->header).field_2,"\t\tendloop\n");
    std::operator<<(poVar1,"\tendfacet\n");
  }
  poVar1 = std::operator<<((ostream *)&(s_local->header).field_2,"endsolid ");
  poVar1 = std::operator<<(poVar1,(string *)num_vertices);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void write_ascii(streamT& out, const basic_solid<T>&s)
        {
            out << "solid " << s.header << "\n";
            
            const size_t num_vertices = std::min(s.normals.size(), s.vertices.size()/3);

            for (size_t i = 0; i < num_vertices; ++i)
            {
                out << "\tfacet normal "
                    << s.normals[i][0] << " "
                    << s.normals[i][1] << " "
                    << s.normals[i][2] << " "
                    << "\n";

                out << "\t\touter loop\n";
                for (size_t j = 0; j < 3; ++j)
                {
                    out << "\t\t\tvertex "
                        << s.vertices[3 * i + j][0] << " "
                        << s.vertices[3 * i + j][1] << " "
                        << s.vertices[3 * i + j][2] << " "
                        << "\n";
                }
                out << "\t\tendloop\n"
                    << "\tendfacet\n";
            }
            out << "endsolid " << s.header << "\n";
        }